

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

int __thiscall TCPConnection::ReadLine(TCPConnection *this,char *buffer,int size)

{
  bool bVar1;
  int iVar2;
  int local_28;
  int bytesProcessed;
  bool done;
  char c;
  int i;
  int size_local;
  char *buffer_local;
  TCPConnection *this_local;
  
  bVar1 = false;
  local_28 = 0;
  _i = buffer;
  do {
    if (bVar1) break;
    iVar2 = Read(this);
    if (iVar2 == -1) {
      *_i = '\0';
      break;
    }
    bytesProcessed._0_1_ = (char)iVar2;
    local_28 = local_28 + 1;
    if ((char)bytesProcessed == '\n') {
      *_i = '\0';
      bVar1 = true;
    }
    else if ((char)bytesProcessed == '\r') {
      *_i = '\0';
    }
    else {
      *_i = (char)bytesProcessed;
    }
    _i = _i + 1;
  } while (local_28 != size);
  *_i = '\0';
  return local_28;
}

Assistant:

int TCPConnection::ReadLine(char* buffer, int size)
{
    int i;
    char c;
    bool done = false;
    int bytesProcessed = 0;

    while (!done)
    {
        i = Read();
        if (i == -1)
        {
            *buffer = 0;
            break;
        }
        c = (char)i;
        bytesProcessed++;
        switch (c)
        {
        case '\r': *buffer++ = 0; break;
        case '\n':
            *buffer++ = 0;
            done = true;
            break;
        default: *buffer++ = c; break;
        }

        if (bytesProcessed == size)
        {
            break;
        }
    }

    *buffer = 0;
    return bytesProcessed;
}